

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

void __thiscall QXmlStreamReaderPrivate::resolveDtd(QXmlStreamReaderPrivate *this)

{
  long lVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QList<QXmlStreamEntityDeclaration> *in_RDI;
  long in_FS_OFFSET;
  QXmlStreamEntityDeclaration *publicEntityDeclaration;
  EntityDeclaration *entityDeclaration;
  qsizetype i_1;
  QXmlStreamNotationDeclaration *publicNotationDeclaration;
  NotationDeclaration *notationDeclaration;
  qsizetype i;
  QXmlString *in_stack_fffffffffffffed8;
  QList<QXmlStreamNotationDeclaration> *in_stack_fffffffffffffee0;
  QList<QXmlStreamEntityDeclaration> *this_00;
  qsizetype in_stack_fffffffffffffee8;
  XmlStringRef *in_stack_ffffffffffffff10;
  XmlStringRef *i_00;
  XmlStringRef *this_01;
  qsizetype local_d8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::size
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration> *)(in_RDI + 0x16))
  ;
  QList<QXmlStreamNotationDeclaration>::resize
            ((QList<QXmlStreamNotationDeclaration> *)in_RDI,in_stack_fffffffffffffee8);
  local_d8 = 0;
  while( true ) {
    qVar3 = local_d8;
    qVar2 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::size
                      ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration> *)
                       (in_RDI + 0x16));
    if (qVar2 <= qVar3) break;
    QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::at
              ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration> *)
               (in_RDI + 0x16),local_d8);
    QList<QXmlStreamNotationDeclaration>::operator[]
              (in_stack_fffffffffffffee0,(qsizetype)in_stack_fffffffffffffed8);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_ffffffffffffff10);
    QtPrivate::QXmlString::operator=
              ((QXmlString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x64990c);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_ffffffffffffff10);
    QtPrivate::QXmlString::operator=
              ((QXmlString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x649945);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(in_stack_ffffffffffffff10);
    QtPrivate::QXmlString::operator=
              ((QXmlString *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x64997e);
    local_d8 = local_d8 + 1;
  }
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration>::clear
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::NotationDeclaration> *)(in_RDI + 0x16))
  ;
  this_00 = in_RDI + 0x1a;
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::size
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration> *)(in_RDI + 0x19));
  QList<QXmlStreamEntityDeclaration>::resize(in_RDI,qVar3);
  i_00 = (XmlStringRef *)0x0;
  while( true ) {
    this_01 = i_00;
    qVar3 = QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::size
                      ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration> *)
                       (in_RDI + 0x19));
    if (qVar3 <= (long)i_00) break;
    QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::at
              ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration> *)(in_RDI + 0x19),
               (qsizetype)this_01);
    QList<QXmlStreamEntityDeclaration>::operator[](this_00,(qsizetype)i_00);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(this_01);
    QtPrivate::QXmlString::operator=((QXmlString *)this_00,(QXmlString *)i_00);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x649a86);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(this_01);
    QtPrivate::QXmlString::operator=((QXmlString *)this_00,(QXmlString *)i_00);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x649abf);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(this_01);
    QtPrivate::QXmlString::operator=((QXmlString *)this_00,(QXmlString *)i_00);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x649af8);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(this_01);
    QtPrivate::QXmlString::operator=((QXmlString *)this_00,(QXmlString *)i_00);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x649b28);
    QtPrivate::XmlStringRef::operator_cast_to_QXmlString(this_01);
    QtPrivate::QXmlString::operator=((QXmlString *)this_00,(QXmlString *)i_00);
    QtPrivate::QXmlString::~QXmlString((QXmlString *)0x649b58);
    i_00 = (XmlStringRef *)((long)&this_01->m_string + 1);
  }
  QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration>::clear
            ((QXmlStreamSimpleStack<QXmlStreamReaderPrivate::EntityDeclaration> *)(in_RDI + 0x19));
  QHash<QStringView,_QXmlStreamReaderPrivate::Entity>::clear
            ((QHash<QStringView,_QXmlStreamReaderPrivate::Entity> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReaderPrivate::resolveDtd()
{
    publicNotationDeclarations.resize(notationDeclarations.size());
    for (qsizetype i = 0; i < notationDeclarations.size(); ++i) {
        const QXmlStreamReaderPrivate::NotationDeclaration &notationDeclaration = notationDeclarations.at(i);
        QXmlStreamNotationDeclaration &publicNotationDeclaration = publicNotationDeclarations[i];
        publicNotationDeclaration.m_name = notationDeclaration.name;
        publicNotationDeclaration.m_systemId = notationDeclaration.systemId;
        publicNotationDeclaration.m_publicId = notationDeclaration.publicId;

    }
    notationDeclarations.clear();
    publicEntityDeclarations.resize(entityDeclarations.size());
    for (qsizetype i = 0; i < entityDeclarations.size(); ++i) {
        const QXmlStreamReaderPrivate::EntityDeclaration &entityDeclaration = entityDeclarations.at(i);
        QXmlStreamEntityDeclaration &publicEntityDeclaration = publicEntityDeclarations[i];
        publicEntityDeclaration.m_name = entityDeclaration.name;
        publicEntityDeclaration.m_notationName = entityDeclaration.notationName;
        publicEntityDeclaration.m_systemId = entityDeclaration.systemId;
        publicEntityDeclaration.m_publicId = entityDeclaration.publicId;
        publicEntityDeclaration.m_value = entityDeclaration.value;
    }
    entityDeclarations.clear();
    parameterEntityHash.clear();
}